

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end.c
# Opt level: O2

int num_extinctions(void)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = 0x2ff93e;
  iVar1 = 0;
  for (lVar3 = 2; lVar3 != 0x4bb; lVar3 = lVar3 + 3) {
    if (((&mvitals[0].born)[lVar3] & 3) != 0) {
      iVar1 = iVar1 + (uint)((*(byte *)(lVar2 + 1) & 0x10) == 0);
    }
    lVar2 = lVar2 + 0x40;
  }
  return iVar1;
}

Assistant:

int num_extinctions(void)
{
    int i, n = 0;

    for (i = LOW_PM; i < NUMMONS; i++)
	if ((mvitals[i].mvflags & G_GONE) && !(mons[i].geno & G_UNIQ))
	    n++;

    return n;
}